

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

void __thiscall hypermind::ASTIfStmt::dump(ASTIfStmt *this,Ostream *os)

{
  element_type *peVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"if  condition : ",0x10);
  peVar1 = (this->condition).super___shared_ptr<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar1->_vptr_ASTNode)(peVar1,os);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  peVar1 = (this->thenBlock).super___shared_ptr<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar1->_vptr_ASTNode)(peVar1,os);
  if ((this->elseBlock).super___shared_ptr<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(os," else ",6);
    peVar1 = (this->elseBlock).super___shared_ptr<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (**peVar1->_vptr_ASTNode)(peVar1,os);
    return;
  }
  return;
}

Assistant:

AST_DUMP(ASTIfStmt) {
        os << _HM_C("if  condition : ");
        condition->dump(os);
        os << std::endl;
        thenBlock->dump(os);
        if (elseBlock != nullptr) {
            os << _HM_C(" else ");
            elseBlock->dump(os);
        }

    }